

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeholder.cpp
# Opt level: O3

Error __thiscall asmjit::CodeHolder::newLabelId(CodeHolder *this,uint32_t *idOut)

{
  ZoneHeap *heap;
  size_t *psVar1;
  ulong uVar2;
  Error EVar3;
  void *pvVar4;
  uint32_t uVar5;
  size_t sStack_28;
  
  *idOut = 0;
  EVar3 = 0xd;
  uVar2 = (this->_labels).super_ZoneVectorBase._length;
  if (uVar2 >> 8 < 0xffffff) {
    heap = &this->_baseHeap;
    if (((this->_labels).super_ZoneVectorBase._capacity == uVar2) &&
       (EVar3 = ZoneVectorBase::_grow(&(this->_labels).super_ZoneVectorBase,heap,8,1), EVar3 != 0))
    {
      return EVar3;
    }
    if (heap->_zone == (Zone *)0x0) {
      newLabelId();
    }
    else {
      pvVar4 = ZoneHeap::_allocZeroed(heap,0x40,&sStack_28);
      if (pvVar4 != (void *)0x0) {
        uVar5 = (int)uVar2 + 0x100;
        *(uint32_t *)((long)pvVar4 + 0xc) = uVar5;
        *(undefined8 *)((long)pvVar4 + 0x14) = 0xffffffff00000000;
        *(undefined8 *)((long)pvVar4 + 0x20) = 0;
        uVar2 = (this->_labels).super_ZoneVectorBase._length;
        if (uVar2 < (this->_labels).super_ZoneVectorBase._capacity) {
          *(void **)((long)(this->_labels).super_ZoneVectorBase._data + uVar2 * 8) = pvVar4;
          psVar1 = &(this->_labels).super_ZoneVectorBase._length;
          *psVar1 = *psVar1 + 1;
          *idOut = uVar5;
          return 0;
        }
        newLabelId();
      }
    }
    EVar3 = 1;
  }
  return EVar3;
}

Assistant:

Error CodeHolder::newLabelId(uint32_t& idOut) noexcept {
  idOut = 0;

  size_t index = _labels.getLength();
  if (ASMJIT_LIKELY(index >= Operand::kPackedIdCount))
    return DebugUtils::errored(kErrorLabelIndexOverflow);

  ASMJIT_PROPAGATE(_labels.willGrow(&_baseHeap));
  LabelEntry* le = _baseHeap.allocZeroedT<LabelEntry>();

  if (ASMJIT_UNLIKELY(!le))
    return DebugUtils::errored(kErrorNoHeapMemory);;

  uint32_t id = Operand::packId(static_cast<uint32_t>(index));
  le->_setId(id);
  le->_parentId = 0;
  le->_sectionId = SectionEntry::kInvalidId;
  le->_offset = 0;

  _labels.appendUnsafe(le);
  idOut = id;
  return kErrorOk;
}